

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O0

void __thiscall Alice::BlindPermuteData(Alice *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  Server *this_00;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  int local_80;
  int local_7c;
  int j_1;
  int i_1;
  vector<DataElement,_std::allocator<DataElement>_> local_60;
  int local_44;
  int local_40;
  int j;
  int i;
  allocator<DataElement> local_29;
  undefined1 local_28 [8];
  vector<DataElement,_std::allocator<DataElement>_> V;
  Alice *this_local;
  
  iVar1 = (this->super_Party).n_d;
  V.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::allocator<DataElement>::allocator(&local_29);
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)local_28,(long)iVar1,&local_29);
  std::allocator<DataElement>::~allocator(&local_29);
  for (local_40 = 0; local_40 < (this->super_Party).n_d; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
      pvVar4 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&(this->super_Party).D,(long)local_40);
      pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,(long)local_44);
      lVar2 = *pvVar5;
      pvVar4 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&(this->super_Party).R_D,(long)local_40);
      pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,(long)local_44);
      lVar3 = *pvVar5;
      pvVar6 = std::vector<DataElement,_std::allocator<DataElement>_>::operator[]
                         ((vector<DataElement,_std::allocator<DataElement>_> *)local_28,
                          (long)local_40);
      pvVar6->val[local_44] = lVar2 + lVar3;
    }
  }
  this_00 = this->srv;
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            (&local_60,(vector<DataElement,_std::allocator<DataElement>_> *)local_28);
  Server::SendDataVector(this_00,&local_60,(this->super_Party).n_d);
  std::vector<DataElement,_std::allocator<DataElement>_>::~vector(&local_60);
  Server::ReceiveDataVector((vector<DataElement,_std::allocator<DataElement>_> *)&j_1,this->srv);
  std::vector<DataElement,_std::allocator<DataElement>_>::operator=
            ((vector<DataElement,_std::allocator<DataElement>_> *)local_28,
             (vector<DataElement,_std::allocator<DataElement>_> *)&j_1);
  std::vector<DataElement,_std::allocator<DataElement>_>::~vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)&j_1);
  for (local_7c = 0; local_7c < (this->super_Party).n_d; local_7c = local_7c + 1) {
    for (local_80 = 0; local_80 < 2; local_80 = local_80 + 1) {
      pvVar6 = std::vector<DataElement,_std::allocator<DataElement>_>::operator[]
                         ((vector<DataElement,_std::allocator<DataElement>_> *)local_28,
                          (long)local_7c);
      lVar2 = pvVar6->val[local_80];
      pvVar4 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&this->Pi_D_diff_R_DB_R_DA,(long)local_7c);
      pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,(long)local_80);
      lVar3 = *pvVar5;
      pvVar4 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&(this->super_Party).D,(long)local_7c);
      pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,(long)local_80);
      *pvVar5 = lVar2 + lVar3;
    }
  }
  std::vector<DataElement,_std::allocator<DataElement>_>::~vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)local_28);
  return;
}

Assistant:

void Alice::BlindPermuteData()
{
    std::vector<DataElement> V(n_d);
    for(int i=0; i<n_d; i++)
        for(int j=0; j<2; j++)
            V[i].val[j] = D[i][j] + R_D[i][j]; //masking Alice's data share
    srv->SendDataVector(V, n_d);    //sending Alice's masked data share to Bob for BlindPermutation
    V = srv->ReceiveDataVector();   //receiving Alice's BlindPermuted share of D
    for(int i=0; i<n_d; i++)
        for(int j=0; j<2; j++)
            D[i][j] = V[i].val[j] + Pi_D_diff_R_DB_R_DA[i][j]; //Adjusting for the resplit
}